

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

wstring_view __thiscall mjs::lexer::get_regex_literal(lexer *this)

{
  token_type tVar1;
  wchar_t wVar2;
  ulong uVar3;
  byte bVar4;
  bool bVar5;
  runtime_error *this_00;
  wchar_t *pwVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  wstring_view wVar10;
  
  if ((int)this->version_ < 1) {
    __assert_fail("version_ >= version::es3 && \"Regular expression literals are not support until ES3\""
                  ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                  ,600,"std::wstring_view mjs::lexer::get_regex_literal()");
  }
  tVar1 = (this->current_token_).type_;
  if ((tVar1 != divideequal) && (tVar1 != divide)) {
    __assert_fail("current_token_.type() == token_type::divide || current_token_.type() == token_type::divideequal"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                  ,0x259,"std::wstring_view mjs::lexer::get_regex_literal()");
  }
  uVar3 = this->text_pos_;
  uVar7 = (ulong)(tVar1 == divide) | 0xfffffffffffffffe;
  lVar8 = uVar7 + uVar3;
  if (!CARRY8(uVar7,uVar3)) {
    __assert_fail("start < text_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x25b,"std::wstring_view mjs::lexer::get_regex_literal()");
  }
  uVar7 = (this->text_)._M_len;
  if (uVar3 < uVar7) {
    pwVar6 = (this->text_)._M_str;
    bVar5 = false;
    bVar4 = 0;
    do {
      sVar9 = uVar3 + 1;
      wVar2 = pwVar6[uVar3];
      if (((wVar2 == L'\n') || (wVar2 == L'\r')) || ((wVar2 & 0xfffffffeU) == 0x2028)) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Line terminator in regular expression literal");
        goto LAB_00172837;
      }
      if (wVar2 == L'\\') {
        bVar5 = (bool)(bVar5 ^ 1);
      }
      else {
        if (!bVar5) {
          if (wVar2 == L'/') {
            if (!(bool)(this->version_ != es3 & bVar4)) {
              this->text_pos_ = sVar9;
              if (uVar7 <= sVar9) goto LAB_001727fa;
              goto LAB_001727d2;
            }
LAB_00172791:
            bVar4 = 1;
          }
          else if (wVar2 == L']') {
            bVar4 = 0;
          }
          else if (wVar2 == L'[') goto LAB_00172791;
        }
        bVar5 = false;
      }
      this->text_pos_ = sVar9;
      uVar3 = sVar9;
    } while (sVar9 != uVar7);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unterminated regular expression literal");
LAB_00172837:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  while( true ) {
    sVar9 = sVar9 + 1;
    this->text_pos_ = sVar9;
    if ((this->text_)._M_len <= sVar9) break;
LAB_001727d2:
    bVar5 = anon_unknown_2::is_identifier_part((this->text_)._M_str[sVar9],this->version_);
    sVar9 = this->text_pos_;
    if (!bVar5) break;
  }
  pwVar6 = (this->text_)._M_str;
LAB_001727fa:
  next_token(this);
  wVar10._M_str = pwVar6 + lVar8;
  wVar10._M_len = sVar9 - lVar8;
  return wVar10;
}

Assistant:

std::wstring_view lexer::get_regex_literal() {
    assert(version_ >= version::es3 &&  "Regular expression literals are not support until ES3");
    assert(current_token_.type() == token_type::divide || current_token_.type() == token_type::divideequal);
    const size_t start = text_pos_ - (current_token_.type() == token_type::divide ? 1 : 2);
    assert(start < text_pos_);

    // Body
    for (bool quote = false, in_class = false;; ++text_pos_) {
        if (text_pos_ >= text_.size()) {
            throw std::runtime_error("Unterminated regular expression literal");
        }
        const auto ch = text_[text_pos_];
        if (is_line_terminator(ch, version_)) {
            throw std::runtime_error("Line terminator in regular expression literal");
        } else if (ch == '\\') {
            quote = !quote;
            continue;
        } else if (quote) {
            quote = false;
            continue;
        }
        assert(!quote && ch != '\\');

        if (ch == ']') {
            in_class = false;
        } else if (ch == '[') {
            in_class = true;
        } else if (ch == '/' && (!in_class || version_ < version::es5)) {
            // forward slash can be unquoted in character classes in ES5.1
            ++text_pos_; // The final '/' is part of the regular expression
            break;
        }
    }

    // Flags
    for (; text_pos_ < text_.size(); ++text_pos_) {
        if (!is_identifier_part(text_[text_pos_], version_)) {
            break;
        }
    }

    const std::wstring_view regex_lit{&text_[start], text_pos_ - start};

    next_token();

    return regex_lit;
}